

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

FrameStatus __thiscall Http2::Frame::validateHeader(Frame *this)

{
  long lVar1;
  FrameType FVar2;
  bool bVar3;
  quint32 qVar4;
  Frame *this_00;
  long in_FS_OFFSET;
  quint32 framePayloadSize;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  FrameFlag flag;
  Frame *in_stack_ffffffffffffffd0;
  FrameStatus local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = payloadSize(in_stack_ffffffffffffffd0);
  if (qVar4 < 0x1000000) {
    FVar2 = type((Frame *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    flag = (FrameFlag)((uint)in_stack_ffffffffffffffcc >> 0x18);
    this_00 = (Frame *)(ulong)(byte)(FVar2 - PRIORITY);
    switch(this_00) {
    case (Frame *)0x0:
      if (qVar4 != 5) {
        local_10 = sizeError;
        goto LAB_0029d373;
      }
      break;
    case (Frame *)0x1:
    case (Frame *)0x6:
      if (qVar4 != 4) {
        local_10 = sizeError;
        goto LAB_0029d373;
      }
      break;
    case (Frame *)0x2:
      flags(this_00);
      bVar3 = QFlags<Http2::FrameFlag>::testFlag((QFlags<Http2::FrameFlag> *)this_00,flag);
      if (!bVar3) {
        qVar4 = qVar4 % 6;
      }
      if (qVar4 != 0) {
        local_10 = sizeError;
        goto LAB_0029d373;
      }
      break;
    case (Frame *)0x3:
      if (qVar4 < 4) {
        local_10 = sizeError;
        goto LAB_0029d373;
      }
      break;
    case (Frame *)0x4:
      if (qVar4 != 8) {
        local_10 = sizeError;
        goto LAB_0029d373;
      }
      break;
    case (Frame *)0x5:
      if (qVar4 < 8) {
        local_10 = sizeError;
        goto LAB_0029d373;
      }
    }
    local_10 = goodFrame;
  }
  else {
    local_10 = sizeError;
  }
LAB_0029d373:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

FrameStatus Frame::validateHeader() const
{
    // Should be called only on a frame with
    // a complete header.
    Q_ASSERT(buffer.size() >= frameHeaderSize);

    const auto framePayloadSize = payloadSize();
    // 4.2 Frame Size
    if (framePayloadSize > maxPayloadSize)
        return FrameStatus::sizeError;

    switch (type()) {
    case FrameType::SETTINGS:
        // SETTINGS ACK can not have any payload.
        // The payload of a SETTINGS frame consists of zero
        // or more parameters, each consisting of an unsigned
        // 16-bit setting identifier and an unsigned 32-bit value.
        // Thus the payload size must be a multiple of 6.
        if (flags().testFlag(FrameFlag::ACK) ? framePayloadSize : framePayloadSize % 6)
            return FrameStatus::sizeError;
        break;
    case FrameType::PRIORITY:
        // 6.3 PRIORITY
        if (framePayloadSize != 5)
            return FrameStatus::sizeError;
        break;
    case FrameType::PING:
        // 6.7 PING
        if (framePayloadSize != 8)
            return FrameStatus::sizeError;
        break;
    case FrameType::GOAWAY:
        // 6.8 GOAWAY
        if (framePayloadSize < 8)
            return FrameStatus::sizeError;
        break;
    case FrameType::RST_STREAM:
    case FrameType::WINDOW_UPDATE:
        // 6.4 RST_STREAM, 6.9 WINDOW_UPDATE
        if (framePayloadSize != 4)
            return FrameStatus::sizeError;
        break;
    case FrameType::PUSH_PROMISE:
        // 6.6 PUSH_PROMISE
        if (framePayloadSize < 4)
            return FrameStatus::sizeError;
        break;
    default:
        // DATA/HEADERS/CONTINUATION will be verified
        // when we have payload.
        // Frames of unknown types are ignored (5.1)
        break;
    }

    return FrameStatus::goodFrame;
}